

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary.cc
# Opt level: O0

void __thiscall
fasttext::Dictionary::addNgrams(Dictionary *this,vector<int,_std::allocator<int>_> *line,int32_t n)

{
  size_type sVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *this_00;
  int in_EDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  int32_t j;
  uint64_t h;
  int32_t i;
  int32_t line_size;
  value_type_conflict *in_stack_ffffffffffffff98;
  int local_2c;
  long local_28;
  int local_1c;
  
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  for (local_1c = 0; local_1c < (int)sVar1; local_1c = local_1c + 1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_1c);
    local_28 = (long)*pvVar2;
    local_2c = local_1c;
    while (local_2c = local_2c + 1, local_2c < (int)sVar1 && local_2c < local_1c + in_EDX) {
      this_00 = (vector<int,_std::allocator<int>_> *)(local_28 * 0x6eac5db);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_2c);
      local_28 = (long)&(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start + (long)*pvVar2;
      std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15320e);
      std::vector<int,_std::allocator<int>_>::push_back(this_00,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

void Dictionary::addNgrams(std::vector<int32_t>& line, int32_t n) const {
  int32_t line_size = line.size();
  for (int32_t i = 0; i < line_size; i++) {
    uint64_t h = line[i];
    for (int32_t j = i + 1; j < line_size && j < i + n; j++) {
      h = h * 116049371 + line[j];
      line.push_back(nwords_ + (h % args_->bucket));
    }
  }
}